

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultSupermap.hpp
# Opt level: O2

unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
 __thiscall
supermap::DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::build
          (DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
          unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
          *nested,BuildParameters *params)

{
  Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this_00;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
  indexSupplier;
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>_()>
  indexListSupplier;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  undefined1 local_108 [16];
  code *local_f8;
  code *local_f0;
  anon_class_40_2_6f9b86c8 local_e8;
  undefined1 local_b8 [16];
  _Any_data local_a8 [2];
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
  local_88;
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>_()>
  local_68;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
  local_48;
  
  local_a8[0]._M_pod_data[0] = '\x01';
  std::make_shared<supermap::io::TemporaryFolder,std::__cxx11::string_const&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (bool *)&params->folderName);
  std::make_unique<supermap::io::DiskFileManager>();
  std::
  make_shared<supermap::io::EncapsulatedFileManager,std::shared_ptr<supermap::io::TemporaryFolder>,std::unique_ptr<supermap::io::DiskFileManager,std::default_delete<supermap::io::DiskFileManager>>>
            ((shared_ptr<supermap::io::TemporaryFolder> *)&local_e8,
             (unique_ptr<supermap::io::DiskFileManager,_std::default_delete<supermap::io::DiskFileManager>_>
              *)local_108);
  local_b8._0_8_ = local_e8.maxRamLoad;
  local_b8._8_8_ = local_e8.registerSupplier.super__Function_base._M_functor._M_unused._M_object;
  local_e8.maxRamLoad = 0;
  local_e8.registerSupplier.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.registerSupplier);
  if ((long *)local_128._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_128._M_unused._M_object + 0x30))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:58:29)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:58:29)>
             ::_M_manager;
  local_128._M_unused._0_8_ = (undefined8)params->errorProbability;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:63:37)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:63:37)>
              ::_M_manager;
  local_e8.maxRamLoad = params->batchSize;
  std::
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
  ::function(&local_e8.registerSupplier,
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
              *)&local_128);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>>,std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>>>>()>
  ::
  function<supermap::DefaultSupermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::build(std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128ul>,unsigned_long,unsigned_long>,std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128ul>,unsigned_long,unsigned_long>>>&&,supermap::DefaultSupermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::BuildParameters_const&)::_lambda()_2_,void>
            ((function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>>,std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>>>>()>
              *)local_a8[0]._M_pod_data,&local_e8);
  std::_Function_base::~_Function_base(&local_e8.registerSupplier.super__Function_base);
  this_00 = (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)
            operator_new(0x1438);
  std::
  make_unique<supermap::KeyValueShrinkableStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>,char_const(&)[19],char_const(&)[15],std::shared_ptr<supermap::io::FileManager>&,std::function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>>>()>&>
            ((char (*) [19])&local_e8,(char (*) [15])"storage-not-sorted",
             (shared_ptr<supermap::io::FileManager> *)"storage-sorted",
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
              *)local_b8);
  std::
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
  ::function(&local_48,
             (function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_&&)>
              *)local_108);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>_()>
  ::function(&local_68,
             (function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>_()>
              *)local_a8);
  std::
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
  ::function(&local_88,
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>_>_>_()>
              *)&local_128);
  Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::Supermap
            (this_00,nested,
             (unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
              *)&local_e8,&local_48,&local_68,&local_88,params->batchSize,params->maxNotSortedPart);
  *(Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> **)this = this_00;
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  if ((long *)local_e8.maxRamLoad != (long *)0x0) {
    (**(code **)(*(long *)local_e8.maxRamLoad + 0x18))();
  }
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  return (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<KVS> build(
        std::unique_ptr<RamStorageBase> &&nested,
        const BuildParameters &params
    ) {
        std::shared_ptr<supermap::io::FileManager> fileManager
            = std::make_shared<supermap::io::EncapsulatedFileManager>(
                std::make_shared<supermap::io::TemporaryFolder>(params.folderName, true),
                std::make_unique<supermap::io::DiskFileManager>()
            );

        std::function<std::unique_ptr<IndexStorageBase>(IndexStorageBase &&)>
            indexSupplier = [](IndexStorageBase &&sortedStorage) {
            return std::make_unique<FilteredIndexStorage>(std::move(sortedStorage));
        };

        std::function<std::unique_ptr<Register>()>
            innerRegisterSupplier = [errorProbability = params.errorProbability]() {
            return std::make_unique<FilteringRegister<KI, K>>(
                [errorProbability = errorProbability]() {
                    return std::make_unique<BloomFilter<K>>(
                        errorProbability,
                        std::make_unique<XXHasher>()
                    );
                },
                [](const KI &ki) { return ki.key; }
            );
        };

        std::function<std::unique_ptr<IndexStorageListBase>()>
            indexListSupplier = [maxRamLoad = params.batchSize, registerSupplier = innerRegisterSupplier]() {
            return std::make_unique<DefaultBinaryCollapsingList>(
                maxRamLoad,
                registerSupplier
            );
        };

        return std::unique_ptr<KVS>(
            new Smap(
                std::move(nested),
                std::make_unique<DiskStorage>(
                    "storage-not-sorted",
                    "storage-sorted",
                    fileManager,
                    innerRegisterSupplier
                ),
                indexSupplier,
                indexListSupplier,
                innerRegisterSupplier,
                params.batchSize,
                params.maxNotSortedPart
            )
        );
    }